

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xsatCnfReader.c
# Opt level: O3

int xSAT_ReadInt(char **pIn)

{
  char cVar1;
  byte bVar2;
  uint uVar3;
  int iVar4;
  ushort **ppuVar5;
  undefined4 *puVar6;
  void *pvVar7;
  void *pvVar8;
  undefined8 *puVar9;
  char *pcVar10;
  int iVar11;
  long lVar12;
  
  ppuVar5 = __ctype_b_loc();
  pcVar10 = *pIn;
  cVar1 = *pcVar10;
  bVar2 = *(byte *)((long)*ppuVar5 + (long)cVar1 * 2 + 1);
  while ((bVar2 & 0x20) != 0) {
    pcVar10 = pcVar10 + 1;
    *pIn = pcVar10;
    cVar1 = *pcVar10;
    bVar2 = *(byte *)((long)*ppuVar5 + (long)cVar1 * 2 + 1);
  }
  if ((cVar1 == '-') || (cVar1 == '+')) {
    pcVar10 = pcVar10 + 1;
    *pIn = pcVar10;
  }
  lVar12 = (long)*pcVar10;
  if ((*(byte *)((long)*ppuVar5 + lVar12 * 2 + 1) & 8) != 0) {
    iVar11 = 0;
    do {
      pcVar10 = pcVar10 + 1;
      iVar11 = (int)(char)lVar12 + iVar11 * 10 + -0x30;
      *pIn = pcVar10;
      lVar12 = (long)*pcVar10;
    } while ((*(byte *)((long)*ppuVar5 + lVar12 * 2 + 1) & 8) != 0);
    iVar4 = -iVar11;
    if (cVar1 != '-') {
      iVar4 = iVar11;
    }
    return iVar4;
  }
  xSAT_ReadInt_cold_1();
  puVar6 = (undefined4 *)calloc(1,0x1e8);
  *(undefined8 *)(puVar6 + 100) = 0x3fe999999999999a;
  *(undefined8 *)(puVar6 + 0x66) = 0x3ff6666666666666;
  *(undefined8 *)(puVar6 + 0x68) = 0x3200002710;
  *(undefined8 *)(puVar6 + 0x6a) = 0x7d000001388;
  *(undefined8 *)(puVar6 + 0x6c) = 0x3e80000012c;
  *(undefined8 *)(puVar6 + 0x6e) = 0x3f0000000000001e;
  *(undefined8 *)(puVar6 + 0x74) = 0x14c924d692ca61b;
  puVar6[0x73] = 200;
  *(undefined8 *)(puVar6 + 0x70) = 0x3fee666666666666;
  *(undefined8 *)(puVar6 + 0x76) = 0x60000001e;
  puVar6[0x78] = 0x3e99999a;
  *puVar6 = 1;
  pvVar7 = calloc(1,0x10);
  *(void **)(puVar6 + 2) = pvVar7;
  pvVar7 = calloc(1,0x10);
  *(void **)(puVar6 + 4) = pvVar7;
  pvVar7 = calloc(1,0x18);
  *(undefined4 *)((long)pvVar7 + 4) = 0x110050;
  pvVar8 = malloc(0x440140);
  *(void **)((long)pvVar7 + 0x10) = pvVar8;
  *(void **)(puVar6 + 6) = pvVar7;
  pvVar7 = calloc(1,0x10);
  *(void **)(puVar6 + 10) = pvVar7;
  pvVar7 = calloc(1,0x10);
  *(void **)(puVar6 + 8) = pvVar7;
  puVar9 = (undefined8 *)malloc(0x10);
  *puVar9 = 4;
  pvVar7 = calloc(0x60,0x18);
  puVar9[1] = pvVar7;
  *(undefined8 **)(puVar6 + 0xc) = puVar9;
  *(undefined8 *)(puVar6 + 0xe) = 0x800000000000;
  puVar6[0x10] = 0x800;
  pvVar7 = calloc(1,0x10);
  *(void **)(puVar6 + 0x12) = pvVar7;
  puVar9 = (undefined8 *)malloc(0x18);
  puVar9[2] = pvVar7;
  pvVar7 = calloc(1,0x10);
  *puVar9 = pvVar7;
  pvVar7 = calloc(1,0x10);
  puVar9[1] = pvVar7;
  *(undefined8 **)(puVar6 + 0x14) = puVar9;
  pvVar7 = calloc(1,0x10);
  *(void **)(puVar6 + 0x16) = pvVar7;
  pvVar7 = calloc(1,0x10);
  *(void **)(puVar6 + 0x18) = pvVar7;
  pvVar7 = calloc(1,0x10);
  *(void **)(puVar6 + 0x1a) = pvVar7;
  pvVar7 = calloc(1,0x10);
  *(void **)(puVar6 + 0x1c) = pvVar7;
  pvVar7 = calloc(1,0x10);
  *(void **)(puVar6 + 0x1e) = pvVar7;
  pvVar7 = calloc(1,0x10);
  *(void **)(puVar6 + 0x20) = pvVar7;
  uVar3 = puVar6[0x6a];
  pvVar7 = calloc(1,0x20);
  *(uint *)((long)pvVar7 + 4) = uVar3;
  pvVar8 = calloc((ulong)uVar3,4);
  *(void **)((long)pvVar7 + 0x18) = pvVar8;
  *(void **)(puVar6 + 0x30) = pvVar7;
  uVar3 = puVar6[0x69];
  pvVar7 = calloc(1,0x20);
  *(uint *)((long)pvVar7 + 4) = uVar3;
  pvVar8 = calloc((ulong)uVar3,4);
  *(void **)((long)pvVar7 + 0x18) = pvVar8;
  *(void **)(puVar6 + 0x32) = pvVar7;
  *(ulong *)(puVar6 + 0x38) = (ulong)(uint)puVar6[0x6b];
  *(undefined8 *)(puVar6 + 0x34) = 1;
  *(ulong *)(puVar6 + 0x36) = (ulong)(uint)puVar6[0x6b];
  pvVar7 = calloc(1,0x10);
  *(void **)(puVar6 + 0x26) = pvVar7;
  pvVar7 = calloc(1,0x10);
  *(void **)(puVar6 + 0x28) = pvVar7;
  pvVar7 = calloc(1,0x10);
  *(void **)(puVar6 + 0x2a) = pvVar7;
  pvVar7 = calloc(1,0x10);
  *(void **)(puVar6 + 0x2c) = pvVar7;
  pvVar7 = calloc(1,0x10);
  *(void **)(puVar6 + 0x2e) = pvVar7;
  pvVar7 = calloc(1,0x10);
  *(void **)(puVar6 + 0x3c) = pvVar7;
  return (int)puVar6;
}

Assistant:

static int xSAT_ReadInt( char ** pIn )
{
    int val = 0;
    int neg = 0;

    for(; isspace(**pIn); (*pIn)++);
    if ( **pIn == '-' )
        neg = 1,
        (*pIn)++;
    else if ( **pIn == '+' )
        (*pIn)++;
    if ( !isdigit(**pIn) )
        fprintf(stderr, "PARSE ERROR! Unexpected char: %c\n", **pIn),
        exit(1);
    while ( isdigit(**pIn) )
        val = val*10 + (**pIn - '0'),
        (*pIn)++;
    return neg ? -val : val;
}